

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry_&> __thiscall
kj::
Table<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>>
::find<0ul,kj::ReadableDirectory_const*&>
          (Table<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>>
           *this,ReadableDirectory **params)

{
  Maybe<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry_&> MVar1;
  ArrayPtr<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> table;
  HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks> local_20 [8];
  long local_18;
  
  table.size_ = *(size_t *)this;
  table.ptr = (Entry *)(this + 0x20);
  HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>::
  find<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::ReadableDirectory_const*&>
            (local_20,table,
             (ReadableDirectory **)((long)(*(long *)(this + 8) - *(size_t *)this) >> 5));
  MVar1.ptr = (Entry *)0x0;
  if (local_20[0] != (HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>)0x0
     ) {
    MVar1.ptr = (Entry *)(local_18 * 0x20 + *(long *)this);
  }
  return (Maybe<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_MAYBE(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[*pos];
  } else {
    return nullptr;
  }
}